

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quuid.cpp
# Opt level: O3

QDebug operator<<(QDebug dbg,QUuid *id)

{
  storage_type *in_RCX;
  QUuid *in_RDX;
  QTextStream *pQVar1;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QDebugStateSaver saver;
  QDebugStateSaver local_48;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_48,(QDebug *)id);
  pQVar1 = *(QTextStream **)id;
  *(undefined1 *)&pQVar1[3]._vptr_QTextStream = 0;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QUuid(";
  QString::fromUtf8(&local_40,(QString *)0x6,ba);
  QTextStream::operator<<(pQVar1,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(char *)&(*(QTextStream **)id)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(*(QTextStream **)id,' ');
  }
  QUuid::toString(&local_40,in_RDX,WithBraces);
  if ((QChar *)local_40.d.ptr == (QChar *)0x0) {
    local_40.d.ptr = &QString::_empty;
  }
  QDebug::putString((QDebug *)id,(QChar *)local_40.d.ptr,local_40.d.size);
  pQVar1 = *(QTextStream **)id;
  if (*(char *)&pQVar1[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(pQVar1,' ');
    pQVar1 = *(QTextStream **)id;
  }
  QTextStream::operator<<(pQVar1,')');
  if (*(char *)&(*(QTextStream **)id)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(*(QTextStream **)id,' ');
  }
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  id->data1 = 0;
  id->data2 = 0;
  id->data3 = 0;
  ((dbg.stream)->ts)._vptr_QTextStream = *(_func_int ***)id;
  QDebugStateSaver::~QDebugStateSaver(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QUuid &id)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QUuid(" << id.toString() << ')';
    return dbg;
}